

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spirv_glsl.cpp
# Opt level: O2

bool __thiscall
spirv_cross::CompilerGLSL::is_stage_output_variable_masked(CompilerGLSL *this,SPIRVariable *var)

{
  ID id;
  bool bVar1;
  BuiltIn builtin;
  uint32_t location;
  uint32_t component;
  SPIRType *pSVar2;
  
  pSVar2 = Compiler::get<spirv_cross::SPIRType>
                     (&this->super_Compiler,*(uint32_t *)&(var->super_IVariant).field_0xc);
  bVar1 = Compiler::has_decoration(&this->super_Compiler,(ID)(pSVar2->super_IVariant).self.id,Block)
  ;
  if (!bVar1) {
    bVar1 = Compiler::has_decoration
                      (&this->super_Compiler,(ID)(var->super_IVariant).self.id,BuiltIn);
    id.id = (var->super_IVariant).self.id;
    if (bVar1) {
      builtin = Compiler::get_decoration(&this->super_Compiler,id,BuiltIn);
      bVar1 = is_stage_output_builtin_masked(this,builtin);
      return bVar1;
    }
    bVar1 = Compiler::has_decoration(&this->super_Compiler,id,DecorationLocation);
    if (bVar1) {
      location = Compiler::get_decoration
                           (&this->super_Compiler,(ID)(var->super_IVariant).self.id,
                            DecorationLocation);
      component = Compiler::get_decoration
                            (&this->super_Compiler,(ID)(var->super_IVariant).self.id,Component);
      bVar1 = is_stage_output_location_masked(this,location,component);
      return bVar1;
    }
  }
  return false;
}

Assistant:

bool CompilerGLSL::is_stage_output_variable_masked(const SPIRVariable &var) const
{
	auto &type = get<SPIRType>(var.basetype);
	bool is_block = has_decoration(type.self, DecorationBlock);
	// Blocks by themselves are never masked. Must be masked per-member.
	if (is_block)
		return false;

	bool is_builtin = has_decoration(var.self, DecorationBuiltIn);

	if (is_builtin)
	{
		return is_stage_output_builtin_masked(BuiltIn(get_decoration(var.self, DecorationBuiltIn)));
	}
	else
	{
		if (!has_decoration(var.self, DecorationLocation))
			return false;

		return is_stage_output_location_masked(
				get_decoration(var.self, DecorationLocation),
				get_decoration(var.self, DecorationComponent));
	}
}